

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe7At3(uint8_t *buf)

{
  return (ulong)((buf[1] & 3) << 5 | (uint)(*buf >> 3));
}

Assistant:

std::uint64_t readFlUIntLe7At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[1];
    res <<= 5;
    res |= (buf[0] >> 3);
    res &= UINT64_C(0x7f);
    return res;
}